

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::VarConcat::handle_name_abi_cxx11_
          (string *__return_storage_ptr__,VarConcat *this,bool ignore_top)

{
  pointer *__args;
  pointer ppVVar1;
  undefined1 this_00 [8];
  pointer begin;
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer ppVVar2;
  string_view format_str;
  format_args args;
  pointer local_88;
  pointer pcStack_80;
  undefined1 local_78 [16];
  undefined1 auStack_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  string content;
  
  auStack_68 = (undefined1  [8])0x0;
  var_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  var_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVVar2 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar2 != ppVVar1) {
    __args = &var_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      (*((*ppVVar2)->super_IRNode)._vptr_IRNode[0x21])(__args,*ppVVar2,(ulong)ignore_top);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
      if (var_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&content._M_string_length)
      {
        operator_delete(var_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        content._M_string_length + 1);
      }
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 != ppVVar1);
  }
  begin = var_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  this_00 = auStack_68;
  local_88 = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,", ","");
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((string *)
             &var_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)this_00,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )begin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
             in_R8);
  if (local_88 != (pointer)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  local_88 = var_names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcStack_80 = content._M_dataplus._M_p;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x7;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)"{{{0}}}",format_str,args);
  if (var_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&content._M_string_length) {
    operator_delete(var_names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,content._M_string_length + 1)
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string VarConcat::handle_name(bool ignore_top) const {
    std::vector<std::string> var_names;
    for (const auto &ptr : vars_) {
        var_names.emplace_back(ptr->handle_name(ignore_top));
    }
    auto content = string::join(var_names.begin(), var_names.end(), ", ");
    return ::format("{{{0}}}", content);
}